

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

void __thiscall
FastPForLib::CompositeCodec<FastPForLib::SIMDPFor,_FastPForLib::VariableByte>::~CompositeCodec
          (CompositeCodec<FastPForLib::SIMDPFor,_FastPForLib::VariableByte> *this)

{
  SIMDPFor *in_RDI;
  
  (in_RDI->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00480ee8;
  VariableByte::~VariableByte((VariableByte *)0x150c6a);
  SIMDPFor::~SIMDPFor(in_RDI);
  IntegerCODEC::~IntegerCODEC(&in_RDI->super_IntegerCODEC);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}